

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

void polyscope::anon_unknown_1::buildErrorUI(string *message,bool fatal)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  char *pcVar5;
  float fVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [12];
  undefined1 auVar10 [16];
  undefined1 in_ZMM1 [64];
  ImVec2 errorModalSize;
  string errorPopupString;
  ImVec2 local_60;
  ImVec2 local_58 [2];
  undefined1 local_48 [16];
  ImVec4 local_38;
  
  auVar11 = in_ZMM1._4_12_;
  auVar8._8_4_ = 0x3f000000;
  auVar8._0_8_ = 0x3f0000003f000000;
  auVar8._12_4_ = 0x3f000000;
  pcVar4 = "ERROR";
  iVar3 = (int)CONCAT71(in_register_00000031,fatal);
  if (iVar3 != 0) {
    pcVar4 = "FATAL ERROR";
  }
  pcVar5 = pcVar4 + 5;
  if (iVar3 != 0) {
    pcVar5 = pcVar4 + 0xb;
  }
  local_58[0] = (ImVec2)vmovlps_avx(auVar8);
  ImGui::PushStyleVar(5,local_58);
  local_58[0] = (ImVec2)local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,pcVar4,pcVar5);
  ImGui::OpenPopup((char *)local_58[0]);
  IVar7 = ImGui::CalcTextSize((message->_M_dataplus)._M_p,(char *)0x0,false,-1.0);
  auVar10._0_4_ = (float)view::windowWidth / 5.0;
  auVar10._4_12_ = auVar11;
  auVar8 = vminss_avx(ZEXT416((uint)((float)view::windowWidth * 0.5)),
                      ZEXT416((uint)(IVar7.x + 50.0)));
  auVar8 = vmaxss_avx(auVar8,auVar10);
  local_60.x = auVar8._0_4_;
  local_60.y = 0.0;
  ImGui::SetNextWindowSize(&local_60,0);
  local_38.x = 0.6666667;
  local_38.y = 0.0;
  local_38.z = 0.0;
  local_38.w = 1.0;
  ImGui::PushStyleColor(0xb,&local_38);
  bVar2 = ImGui::BeginPopupModal((char *)local_58[0],(bool *)0x0,4);
  if (!bVar2) goto LAB_001ca5af;
  dVar1 = (double)(local_60.x - IVar7.x) * 0.5 + -5.0;
  auVar9._0_4_ = (float)dVar1;
  auVar9._4_4_ = (int)((ulong)dVar1 >> 0x20);
  auVar9._8_8_ = 0;
  auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,auVar9);
  fVar6 = auVar8._0_4_;
  if (0.0 < fVar6) {
    ImGui::Indent(fVar6);
  }
  ImGui::TextWrapped("%s",(message->_M_dataplus)._M_p);
  if (0.0 < fVar6) {
    ImGui::Unindent(fVar6);
  }
  ImGui::Spacing();
  ImGui::Spacing();
  ImGui::Spacing();
  auVar8 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)((local_60.x + -120.0) * 0.5)));
  fVar6 = auVar8._0_4_;
  if (0.0 < fVar6) {
    ImGui::Indent(fVar6);
  }
  local_38._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x42f00000),0));
  bVar2 = ImGui::Button("My bad.",(ImVec2 *)&local_38);
  if (bVar2) {
LAB_001ca573:
    popContext();
    ImGui::CloseCurrentPopup();
  }
  else {
    bVar2 = ImGui::IsKeyPressed(0x20,true);
    if (bVar2) goto LAB_001ca573;
  }
  bVar2 = ImGui::IsItemHovered(0);
  if (bVar2) {
    ImGui::SetTooltip("(space to dismiss)");
  }
  if (0.0 < fVar6) {
    ImGui::Unindent(fVar6);
  }
LAB_001ca5af:
  ImGui::EndPopup();
  ImGui::PopStyleColor(1);
  ImGui::PopStyleVar(1);
  if (local_58[0] != (ImVec2)local_48) {
    operator_delete((void *)local_58[0]);
  }
  return;
}

Assistant:

void buildErrorUI(std::string message, bool fatal) {

  ImGui::PushStyleVar(ImGuiStyleVar_WindowTitleAlign, ImVec2(0.5, 0.5));
  std::string errorPopupString = fatal ? "FATAL ERROR" : "ERROR";
  ImGui::OpenPopup(errorPopupString.c_str());

  // Nice size for error modal
  ImVec2 errorTextSize = ImGui::CalcTextSize(message.c_str());
  ImVec2 errorModalSize(std::max(view::windowWidth / 5.0f, std::min(errorTextSize.x + 50, view::windowWidth / 2.0f)),
                        0);

  ImGui::SetNextWindowSize(errorModalSize);
  ImGui::PushStyleColor(ImGuiCol_TitleBgActive, ImVec4(170. / 255., 0, 0, 1.0));
  if (ImGui::BeginPopupModal(errorPopupString.c_str(), NULL, ImGuiWindowFlags_NoMove)) {

    // Nice text sizing
    float offset = (errorModalSize.x - errorTextSize.x) / 2.0 - 5;
    offset = std::max(offset, 0.0f);
    bool doIndent = offset > 0;
    if (doIndent) {
      ImGui::Indent(offset);
    }

    // Make text
    ImGui::TextWrapped("%s", message.c_str());
    if (doIndent) {
      ImGui::Unindent(offset);
    }

    ImGui::Spacing();
    ImGui::Spacing();
    ImGui::Spacing();

    // Nice button sizing
    float buttonWidth = 120;
    float buttonOffset = (errorModalSize.x - buttonWidth) / 2.0;
    buttonOffset = std::max(buttonOffset, 0.0f);
    doIndent = buttonOffset > 0;
    if (doIndent) {
      ImGui::Indent(buttonOffset);
    }

    // Make a button
    if (ImGui::Button("My bad.", ImVec2(buttonWidth, 0)) || ImGui::IsKeyPressed((int)' ')) {
      popContext();
      ImGui::CloseCurrentPopup();
    }
    if (ImGui::IsItemHovered()) ImGui::SetTooltip("(space to dismiss)");

    if (doIndent) {
      ImGui::Unindent(buttonOffset);
    }
  }

  ImGui::EndPopup();
  ImGui::PopStyleColor();
  ImGui::PopStyleVar();
}